

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MappingTag::Read(ON_MappingTag *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  TYPE TVar3;
  TYPE local_30;
  byte local_29;
  uint i;
  int iStack_24;
  bool rc;
  int mnv;
  int mjv;
  ON_BinaryArchive *archive_local;
  ON_MappingTag *this_local;
  
  _mnv = archive;
  archive_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_24 = 0;
  i = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(_mnv,0x40008000,&stack0xffffffffffffffdc,(int *)&i);
  if (bVar1) {
    local_29 = iStack_24 == 1;
    if (((bool)local_29) &&
       (local_29 = ON_BinaryArchive::ReadUuid(_mnv,&this->m_mapping_id), (bool)local_29)) {
      iVar2 = ON_UuidCompare(&obsolete_default_srfp_mapping_id,&this->m_mapping_id);
      if (iVar2 == 0) {
        (this->m_mapping_id).Data1 = 0;
        (this->m_mapping_id).Data2 = 0;
        (this->m_mapping_id).Data3 = 0;
        (this->m_mapping_id).Data4[0] = '\0';
        (this->m_mapping_id).Data4[1] = '\0';
        (this->m_mapping_id).Data4[2] = '\0';
        (this->m_mapping_id).Data4[3] = '\0';
        (this->m_mapping_id).Data4[4] = '\0';
        (this->m_mapping_id).Data4[5] = '\0';
        (this->m_mapping_id).Data4[6] = '\0';
        (this->m_mapping_id).Data4[7] = '\0';
      }
      local_29 = ON_BinaryArchive::ReadInt(_mnv,&this->m_mapping_crc);
      if ((((bool)local_29) &&
          (local_29 = ON_BinaryArchive::ReadXform(_mnv,&this->m_mesh_xform), (bool)local_29)) &&
         (0 < (int)i)) {
        local_30 = this->m_mapping_type;
        local_29 = ON_BinaryArchive::ReadInt(_mnv,&local_30);
        if ((bool)local_29) {
          TVar3 = ON_TextureMapping::TypeFromUnsigned(local_30);
          this->m_mapping_type = TVar3;
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_mnv);
    if (!bVar1) {
      local_29 = 0;
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_MappingTag::Read(ON_BinaryArchive& archive)
{
  Default();
  int mjv = 0, mnv = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == mjv);
    if (!rc) break;
    rc = archive.ReadUuid(m_mapping_id);
    if(!rc) break;
    if ( 0 == ON_UuidCompare(&obsolete_default_srfp_mapping_id,&m_mapping_id) )
      m_mapping_id = ON_nil_uuid;
    rc = archive.ReadInt(&m_mapping_crc);
    if(!rc) break;
    rc = archive.ReadXform(m_mesh_xform);
    if(!rc) break;

    if ( mnv >= 1 )
    {
      // 1.1 fields
      unsigned int i = static_cast<unsigned int>(m_mapping_type);
      rc = archive.ReadInt(&i);
      if ( rc )
        m_mapping_type = ON_TextureMapping::TypeFromUnsigned(i);
      if (!rc) break;
    }

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  
  return rc;
}